

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O0

void spell_sphere_of_plasma(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  CHAR_DATA *in_RDX;
  undefined2 in_SI;
  undefined2 in_DI;
  AFFECT_DATA af;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  void *in_stack_ffffffffffffff80;
  CHAR_DATA *in_stack_ffffffffffffff88;
  undefined2 in_stack_ffffffffffffff90;
  undefined2 in_stack_ffffffffffffff92;
  undefined2 uVar2;
  undefined2 in_stack_ffffffffffffff94;
  undefined2 in_stack_ffffffffffffff96;
  
  bVar1 = is_affected(in_RDX,(int)gsn_sphere_of_plasma);
  if (bVar1) {
    send_to_char((char *)CONCAT26(in_stack_ffffffffffffff96,
                                  CONCAT24(in_stack_ffffffffffffff94,
                                           CONCAT22(in_stack_ffffffffffffff92,
                                                    in_stack_ffffffffffffff90))),
                 in_stack_ffffffffffffff88);
  }
  else {
    act((char *)CONCAT26(in_stack_ffffffffffffff96,
                         CONCAT24(in_stack_ffffffffffffff94,
                                  CONCAT22(in_stack_ffffffffffffff92,in_stack_ffffffffffffff90))),
        in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
        (void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0);
    act((char *)CONCAT26(in_stack_ffffffffffffff96,
                         CONCAT24(in_stack_ffffffffffffff94,
                                  CONCAT22(in_stack_ffffffffffffff92,in_stack_ffffffffffffff90))),
        in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
        (void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0);
    init_affect((AFFECT_DATA *)0x6ea865);
    uVar2 = 0;
    dice((int)in_RDX,in_stack_ffffffffffffff7c);
    affect_to_char(in_RDX,(AFFECT_DATA *)
                          CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    die_follower((CHAR_DATA *)
                 CONCAT26(in_SI,CONCAT24(in_DI,CONCAT22(uVar2,in_stack_ffffffffffffff90))));
  }
  return;
}

Assistant:

void spell_sphere_of_plasma(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	AFFECT_DATA af;

	if (is_affected(ch, gsn_sphere_of_plasma))
	{
		send_to_char("You cannot create another sphere of plasma yet.\n\r", ch);
		return;
	}

	act("Rippling links of plasma join to form a massive sphere of plasma around you!", ch, nullptr, nullptr, TO_CHAR);
	act("Rippling links of plasma join to form a massive sphere of plasma around $n!", ch, nullptr, nullptr, TO_ROOM);

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_SPELL;
	af.type = sn;
	af.level = level;
	af.owner = ch;
	af.location = 0;
	af.modifier = dice(level / 13, 2);
	af.duration = level / 5;
	af.end_fun = sphere_of_plasma_end;
	af.pulse_fun = sphere_of_plasma_pulse;
	af.mod_name = MOD_PROTECTION;
	affect_to_char(ch, &af);

	die_follower(ch);
}